

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JustInTime.hpp
# Opt level: O2

unique_ptr<Amstrad::FDC,_JustInTimeActor<Amstrad::FDC,_Cycles,_1,_1>::SequencePointAwareDeleter>
__thiscall
JustInTimeActor<Amstrad::FDC,_Cycles,_1,_1>::operator->
          (JustInTimeActor<Amstrad::FDC,_Cycles,_1,_1> *this)

{
  __atomic_flag_data_type _Var1;
  _Head_base<0UL,_Amstrad::FDC_*,_false> extraout_RDX;
  JustInTimeActor<Amstrad::FDC,_Cycles,_1,_1> *in_RSI;
  unique_ptr<Amstrad::FDC,_JustInTimeActor<Amstrad::FDC,_Cycles,_1,_1>::SequencePointAwareDeleter>
  uVar2;
  
  LOCK();
  _Var1 = (in_RSI->flush_concurrency_check_).super___atomic_flag_base._M_i;
  (in_RSI->flush_concurrency_check_).super___atomic_flag_base._M_i = true;
  UNLOCK();
  if (_Var1 == false) {
    flush(in_RSI);
    LOCK();
    (in_RSI->flush_concurrency_check_).super___atomic_flag_base._M_i = false;
    UNLOCK();
    (this->super_Observer)._vptr_Observer = (_func_int **)in_RSI;
    (this->object_).super_i8272.super_MFMController.super_Controller.super_Source._vptr_Source =
         (_func_int **)&in_RSI->object_;
    uVar2._M_t.
    super___uniq_ptr_impl<Amstrad::FDC,_JustInTimeActor<Amstrad::FDC,_Cycles,_1,_1>::SequencePointAwareDeleter>
    ._M_t.
    super__Tuple_impl<0UL,_Amstrad::FDC_*,_JustInTimeActor<Amstrad::FDC,_Cycles,_1,_1>::SequencePointAwareDeleter>
    .super__Head_base<0UL,_Amstrad::FDC_*,_false>._M_head_impl = extraout_RDX._M_head_impl;
    uVar2._M_t.
    super___uniq_ptr_impl<Amstrad::FDC,_JustInTimeActor<Amstrad::FDC,_Cycles,_1,_1>::SequencePointAwareDeleter>
    ._M_t.
    super__Tuple_impl<0UL,_Amstrad::FDC_*,_JustInTimeActor<Amstrad::FDC,_Cycles,_1,_1>::SequencePointAwareDeleter>
    .super__Tuple_impl<1UL,_JustInTimeActor<Amstrad::FDC,_Cycles,_1,_1>::SequencePointAwareDeleter>.
    super__Head_base<1UL,_JustInTimeActor<Amstrad::FDC,_Cycles,_1,_1>::SequencePointAwareDeleter,_false>
    ._M_head_impl.actor_ =
         (_Head_base<1UL,_JustInTimeActor<Amstrad::FDC,_Cycles,_1,_1>::SequencePointAwareDeleter,_false>
          )(_Head_base<1UL,_JustInTimeActor<Amstrad::FDC,_Cycles,_1,_1>::SequencePointAwareDeleter,_false>
            )this;
    return (unique_ptr<Amstrad::FDC,_JustInTimeActor<Amstrad::FDC,_Cycles,_1,_1>::SequencePointAwareDeleter>
            )uVar2._M_t.
             super___uniq_ptr_impl<Amstrad::FDC,_JustInTimeActor<Amstrad::FDC,_Cycles,_1,_1>::SequencePointAwareDeleter>
             ._M_t.
             super__Tuple_impl<0UL,_Amstrad::FDC_*,_JustInTimeActor<Amstrad::FDC,_Cycles,_1,_1>::SequencePointAwareDeleter>
    ;
  }
  __assert_fail("!flush_concurrency_check_.test_and_set()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Machines/Sinclair/ZXSpectrum/../../../ClockReceiver/JustInTime.hpp"
                ,0x7e,
                "auto JustInTimeActor<Amstrad::FDC, Cycles>::operator->() [T = Amstrad::FDC, LocalTimeScale = Cycles, multiplier = 1, divider = 1]"
               );
}

Assistant:

[[nodiscard]] forceinline auto operator->() {
#ifndef NDEBUG
			assert(!flush_concurrency_check_.test_and_set());
#endif
			flush();
#ifndef NDEBUG
			flush_concurrency_check_.clear();
#endif
			return std::unique_ptr<T, SequencePointAwareDeleter>(&object_, SequencePointAwareDeleter(this));
		}